

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O3

DdNode * Cudd_SupersetShortPaths(DdManager *dd,DdNode *f,int numVars,int threshold,int hardlimit)

{
  DdNode *pDVar1;
  
  memOut = 0;
  do {
    dd->reordered = 0;
    pDVar1 = cuddSubsetShortPaths(dd,(DdNode *)((ulong)f ^ 1),numVars,threshold,hardlimit);
    if (dd->reordered != 1) break;
  } while ((memOut & 1) == 0);
  return (DdNode *)((ulong)(pDVar1 != (DdNode *)0x0) ^ (ulong)pDVar1);
}

Assistant:

DdNode *
Cudd_SupersetShortPaths(
  DdManager * dd /* manager */,
  DdNode * f /* function to be superset */,
  int  numVars /* number of variables in the support of f */,
  int  threshold /* maximum number of nodes in the subset */,
  int  hardlimit /* flag: 1 if threshold is a hard limit */)
{
    DdNode *subset, *g;

    g = Cudd_Not(f);
    memOut = 0;
    do {
        dd->reordered = 0;
        subset = cuddSubsetShortPaths(dd, g, numVars, threshold, hardlimit);
    } while((dd->reordered ==1) && (!memOut));

    return(Cudd_NotCond(subset, (subset != NULL)));

}